

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseAttributeType(xmlParserCtxtPtr ctxt,xmlEnumerationPtr *tree)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  xVar1 = *pxVar3;
  if ((((xVar1 == 'C') && (pxVar3[1] == 'D')) && (pxVar3[2] == 'A')) &&
     ((pxVar3[3] == 'T' && (pxVar3[4] == 'A')))) {
    pxVar2->cur = pxVar3 + 5;
    pxVar2->col = pxVar2->col + 5;
    iVar4 = 1;
LAB_0013807d:
    xVar1 = pxVar3[5];
    goto joined_r0x001381bf;
  }
  if (xVar1 == 'I') {
    if (((pxVar3[1] != 'D') || (pxVar3[2] != 'R')) ||
       ((pxVar3[3] != 'E' || ((pxVar3[4] != 'F' || (pxVar3[5] != 'S')))))) {
      if ((((pxVar3[1] == 'D') && (pxVar3[2] == 'R')) && (pxVar3[3] == 'E')) && (pxVar3[4] == 'F'))
      {
        pxVar2->cur = pxVar3 + 5;
        pxVar2->col = pxVar2->col + 5;
        iVar4 = 3;
        goto LAB_0013807d;
      }
      if (pxVar3[1] == 'D') {
        pxVar2->cur = pxVar3 + 2;
        pxVar2->col = pxVar2->col + 2;
        iVar4 = 2;
        xVar1 = pxVar3[2];
        goto joined_r0x001381bf;
      }
      goto LAB_001380b0;
    }
    pxVar2->cur = pxVar3 + 6;
    pxVar2->col = pxVar2->col + 6;
    iVar4 = 4;
LAB_001380e4:
    xVar1 = pxVar3[6];
  }
  else {
LAB_001380b0:
    if (xVar1 == 'E') {
      if (((pxVar3[1] == 'N') && (pxVar3[2] == 'T')) &&
         ((pxVar3[3] == 'I' && ((pxVar3[4] == 'T' && (pxVar3[5] == 'Y')))))) {
        pxVar2->cur = pxVar3 + 6;
        pxVar2->col = pxVar2->col + 6;
        iVar4 = 5;
        goto LAB_001380e4;
      }
      if ((((pxVar3[1] != 'N') || (pxVar3[2] != 'T')) || (pxVar3[3] != 'I')) ||
         (((pxVar3[4] != 'T' || (pxVar3[5] != 'I')) || ((pxVar3[6] != 'E' || (pxVar3[7] != 'S'))))))
      goto LAB_0013812e;
      pxVar2->cur = pxVar3 + 8;
      pxVar2->col = pxVar2->col + 8;
      iVar4 = 6;
    }
    else {
LAB_0013812e:
      if (xVar1 != 'N') {
LAB_001381ca:
        iVar4 = xmlParseEnumeratedType(ctxt,tree);
        return iVar4;
      }
      if (((pxVar3[1] != 'M') || (pxVar3[2] != 'T')) ||
         ((pxVar3[3] != 'O' ||
          ((((pxVar3[4] != 'K' || (pxVar3[5] != 'E')) || (pxVar3[6] != 'N')) || (pxVar3[7] != 'S')))
          ))) {
        if (((((pxVar3[1] != 'M') || (pxVar3[2] != 'T')) || (pxVar3[3] != 'O')) ||
            ((pxVar3[4] != 'K' || (pxVar3[5] != 'E')))) || (pxVar3[6] != 'N')) goto LAB_001381ca;
        pxVar2->cur = pxVar3 + 7;
        pxVar2->col = pxVar2->col + 7;
        iVar4 = 7;
        xVar1 = pxVar3[7];
        goto joined_r0x001381bf;
      }
      pxVar2->cur = pxVar3 + 8;
      pxVar2->col = pxVar2->col + 8;
      iVar4 = 8;
    }
    xVar1 = pxVar3[8];
  }
joined_r0x001381bf:
  if (xVar1 == '\0') {
    xmlParserGrow(ctxt);
  }
  return iVar4;
}

Assistant:

int
xmlParseAttributeType(xmlParserCtxtPtr ctxt, xmlEnumerationPtr *tree) {
    if (CMP5(CUR_PTR, 'C', 'D', 'A', 'T', 'A')) {
	SKIP(5);
	return(XML_ATTRIBUTE_CDATA);
     } else if (CMP6(CUR_PTR, 'I', 'D', 'R', 'E', 'F', 'S')) {
	SKIP(6);
	return(XML_ATTRIBUTE_IDREFS);
     } else if (CMP5(CUR_PTR, 'I', 'D', 'R', 'E', 'F')) {
	SKIP(5);
	return(XML_ATTRIBUTE_IDREF);
     } else if ((RAW == 'I') && (NXT(1) == 'D')) {
        SKIP(2);
	return(XML_ATTRIBUTE_ID);
     } else if (CMP6(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'Y')) {
	SKIP(6);
	return(XML_ATTRIBUTE_ENTITY);
     } else if (CMP8(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'I', 'E', 'S')) {
	SKIP(8);
	return(XML_ATTRIBUTE_ENTITIES);
     } else if (CMP8(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N', 'S')) {
	SKIP(8);
	return(XML_ATTRIBUTE_NMTOKENS);
     } else if (CMP7(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N')) {
	SKIP(7);
	return(XML_ATTRIBUTE_NMTOKEN);
     }
     return(xmlParseEnumeratedType(ctxt, tree));
}